

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O0

void Acec_TreeVerifyPhaseOne(Gia_Man_t *p,Vec_Int_t *vAdds,int iBox)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Gia_Obj_t *pGVar5;
  uint local_74;
  uint local_64;
  uint local_54;
  bool local_4d;
  int fFlip;
  int fFadd;
  int iObj;
  int k;
  uint Truths [3];
  uint TruthMaj;
  uint TruthXor;
  Gia_Obj_t *pObj;
  int iBox_local;
  Vec_Int_t *vAdds_local;
  Gia_Man_t *p_local;
  
  _iObj = 0xcc000000aa;
  Truths[0] = 0xf0;
  iVar1 = Vec_IntEntry(vAdds,iBox * 6 + 2);
  local_4d = false;
  if (iVar1 < 1) {
    iVar2 = Acec_SignBit2(vAdds,iBox,2);
    local_4d = iVar2 != 0;
  }
  uVar4 = (uint)local_4d;
  Gia_ManIncrementTravId(p);
  for (fFadd = 0; fFadd < 3; fFadd = fFadd + 1) {
    iVar2 = Vec_IntEntry(vAdds,iBox * 6 + fFadd);
    if (iVar2 != 0) {
      pGVar5 = Gia_ManObj(p,iVar2);
      uVar3 = Acec_SignBit2(vAdds,iBox,fFadd);
      if (uVar3 == uVar4) {
        local_54 = (&iObj)[fFadd];
      }
      else {
        local_54 = ((&iObj)[fFadd] ^ 0xffffffffU) & 0xff;
      }
      pGVar5->Value = local_54;
      Gia_ObjSetTravIdCurrent(p,pGVar5);
    }
  }
  iVar2 = Vec_IntEntry(vAdds,iBox * 6 + 3);
  pGVar5 = Gia_ManObj(p,iVar2);
  Truths[2] = Acec_TreeVerifyPhaseOne_rec(p,pGVar5);
  uVar3 = Acec_SignBit2(vAdds,iBox,3);
  if (uVar3 == uVar4) {
    local_64 = Truths[2];
  }
  else {
    local_64 = (Truths[2] ^ 0xffffffff) & 0xff;
  }
  Truths[2] = local_64;
  iVar2 = Vec_IntEntry(vAdds,iBox * 6 + 4);
  pGVar5 = Gia_ManObj(p,iVar2);
  Truths[1] = Acec_TreeVerifyPhaseOne_rec(p,pGVar5);
  uVar3 = Acec_SignBit2(vAdds,iBox,4);
  if (uVar3 == uVar4) {
    local_74 = Truths[1];
  }
  else {
    local_74 = (Truths[1] ^ 0xffffffff) & 0xff;
  }
  Truths[1] = local_74;
  if (iVar1 < 1) {
    if (Truths[2] != 0x66) {
      uVar4 = Vec_IntEntry(vAdds,iBox * 6 + 3);
      printf("Hadd %d sum %d is wrong.\n",(ulong)(uint)iBox,(ulong)uVar4);
    }
    if (Truths[1] != 0x88) {
      uVar4 = Vec_IntEntry(vAdds,iBox * 6 + 4);
      printf("Hadd %d carry %d is wrong.\n",(ulong)(uint)iBox,(ulong)uVar4);
    }
  }
  else {
    if (Truths[2] != 0x96) {
      uVar4 = Vec_IntEntry(vAdds,iBox * 6 + 3);
      printf("Fadd %d sum %d is wrong.\n",(ulong)(uint)iBox,(ulong)uVar4);
    }
    if (Truths[1] != 0xe8) {
      uVar4 = Vec_IntEntry(vAdds,iBox * 6 + 4);
      printf("Fadd %d carry %d is wrong.\n",(ulong)(uint)iBox,(ulong)uVar4);
    }
  }
  return;
}

Assistant:

void Acec_TreeVerifyPhaseOne( Gia_Man_t * p, Vec_Int_t * vAdds, int iBox )
{
    Gia_Obj_t * pObj;
    unsigned TruthXor, TruthMaj, Truths[3] = { 0xAA, 0xCC, 0xF0 };
    int k, iObj, fFadd = Vec_IntEntry(vAdds, 6*iBox+2) > 0;
    int fFlip = !fFadd && Acec_SignBit2(vAdds, iBox, 2);

    Gia_ManIncrementTravId( p );
    for ( k = 0; k < 3; k++ )
    {
        iObj = Vec_IntEntry( vAdds, 6*iBox+k );
        if ( iObj == 0 )
            continue;
        pObj = Gia_ManObj( p, iObj );
        pObj->Value = (Acec_SignBit2(vAdds, iBox, k) ^ fFlip) ? 0xFF & ~Truths[k] : Truths[k];
        Gia_ObjSetTravIdCurrent( p, pObj );
    }

    iObj = Vec_IntEntry( vAdds, 6*iBox+3 );
    TruthXor = Acec_TreeVerifyPhaseOne_rec( p, Gia_ManObj(p, iObj) );
    TruthXor = (Acec_SignBit2(vAdds, iBox, 3) ^ fFlip) ? 0xFF & ~TruthXor : TruthXor;

    iObj = Vec_IntEntry( vAdds, 6*iBox+4 );
    TruthMaj = Acec_TreeVerifyPhaseOne_rec( p, Gia_ManObj(p, iObj) );
    TruthMaj = (Acec_SignBit2(vAdds, iBox, 4) ^ fFlip) ? 0xFF & ~TruthMaj : TruthMaj;

    if ( fFadd ) // FADD
    {
        if ( TruthXor != 0x96 )
            printf( "Fadd %d sum %d is wrong.\n", iBox, Vec_IntEntry( vAdds, 6*iBox+3 ) );
        if ( TruthMaj != 0xE8 )
            printf( "Fadd %d carry %d is wrong.\n", iBox, Vec_IntEntry( vAdds, 6*iBox+4 ) );
    }
    else
    {
        //printf( "Sign1 = %d%d%d %d\n", Acec_SignBit(vAdds, iBox, 0), Acec_SignBit(vAdds, iBox, 1), Acec_SignBit(vAdds, iBox, 2), Acec_SignBit(vAdds, iBox, 3) );
        //printf( "Sign2 = %d%d%d %d%d\n", Acec_SignBit2(vAdds, iBox, 0), Acec_SignBit2(vAdds, iBox, 1), Acec_SignBit2(vAdds, iBox, 2), Acec_SignBit2(vAdds, iBox, 3), Acec_SignBit2(vAdds, iBox, 4) );
        if ( TruthXor != 0x66 )
            printf( "Hadd %d sum %d is wrong.\n", iBox, Vec_IntEntry( vAdds, 6*iBox+3 ) );
        if ( TruthMaj != 0x88 )
            printf( "Hadd %d carry %d is wrong.\n", iBox, Vec_IntEntry( vAdds, 6*iBox+4 ) );
    }
}